

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManDfsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int local_40;
  int iObj;
  int k;
  int iFan;
  int iBox;
  int nTerms;
  int iFirst;
  int i;
  Tim_Man_t *pManTime;
  Vec_Int_t *vObjs_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                          ,0x3b0,"void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
        }
        else {
          iVar1 = Gia_ObjId(p,pObj);
          iVar2 = Gia_ManHasMapping(p);
          if (iVar2 == 0) {
            pGVar4 = Gia_ObjFanin0(pObj);
            Gia_ManDfsCollect_rec(p,pGVar4,vObjs);
            pGVar4 = Gia_ObjFanin1(pObj);
            Gia_ManDfsCollect_rec(p,pGVar4,vObjs);
          }
          else {
            iVar2 = Gia_ObjIsLut(p,iVar1);
            if (iVar2 == 0) {
              __assert_fail("Gia_ObjIsLut(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                            ,0x3a3,
                            "void Gia_ManDfsCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
            }
            for (local_40 = 0; iVar2 = Gia_ObjLutSize(p,iVar1), local_40 < iVar2;
                local_40 = local_40 + 1) {
              piVar5 = Gia_ObjLutFanins(p,iVar1);
              pGVar4 = Gia_ManObj(p,piVar5[local_40]);
              Gia_ManDfsCollect_rec(p,pGVar4,vObjs);
            }
          }
          Vec_IntPush(vObjs,iVar1);
        }
      }
      else {
        pGVar4 = Gia_ObjFanin0(pObj);
        Gia_ManDfsCollect_rec(p,pGVar4,vObjs);
      }
    }
    else {
      p_00 = (Tim_Man_t *)p->pManTime;
      if (p_00 != (Tim_Man_t *)0x0) {
        iVar1 = Gia_ObjCioId(pObj);
        iVar1 = Tim_ManBoxForCi(p_00,iVar1);
        if (-1 < iVar1) {
          iVar2 = Tim_ManBoxOutputFirst(p_00,iVar1);
          iVar3 = Tim_ManBoxOutputNum(p_00,iVar1);
          for (nTerms = 0; nTerms < iVar3; nTerms = nTerms + 1) {
            pGVar4 = Gia_ManCi(p,iVar2 + nTerms);
            Gia_ObjSetTravIdCurrent(p,pGVar4);
          }
          iVar2 = Tim_ManBoxInputFirst(p_00,iVar1);
          iVar3 = Tim_ManBoxInputNum(p_00,iVar1);
          for (nTerms = 0; nTerms < iVar3; nTerms = nTerms + 1) {
            pGVar4 = Gia_ManCo(p,iVar2 + nTerms);
            Gia_ManDfsCollect_rec(p,pGVar4,vObjs);
          }
          Vec_IntPush(vObjs,-1 - iVar1);
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManDfsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        if ( pManTime )
        {
            int i, iFirst, nTerms, iBox;
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // pObj is a box input
            {
                // mark box outputs
                iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCi( p, iFirst + i );
                    Gia_ObjSetTravIdCurrent( p, pObj );
                }
                // traverse box inputs
                iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pObj = Gia_ManCo( p, iFirst + i );
                    Gia_ManDfsCollect_rec( p, pObj, vObjs );
                }
                // save the box
                Vec_IntPush( vObjs, -iBox-1 );
            }
        }
        return;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        int iFan, k, iObj = Gia_ObjId(p, pObj);
        if ( Gia_ManHasMapping(p) )
        {
            assert( Gia_ObjIsLut(p, iObj) );
            Gia_LutForEachFanin( p, iObj, iFan, k )
                Gia_ManDfsCollect_rec( p, Gia_ManObj(p, iFan), vObjs );
        }
        else
        {
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin0(pObj), vObjs );
            Gia_ManDfsCollect_rec( p, Gia_ObjFanin1(pObj), vObjs );
        }
        // save the object
        Vec_IntPush( vObjs, iObj );
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
}